

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  ushort *puVar1;
  byte bVar2;
  short sVar3;
  uchar *puVar4;
  bool bVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ushort *puVar11;
  stbtt_vertex *__dest;
  int iVar12;
  short sVar13;
  int was_off;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  byte bVar18;
  short sVar19;
  byte bVar20;
  uint sy;
  ushort uVar21;
  stbtt_vertex *psVar22;
  uint uVar23;
  uint start_off;
  ushort *puVar24;
  uint uVar25;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  stbtt_vertex *local_78;
  stbtt_vertex *comp_verts;
  stbtt_vertex *local_68;
  uint local_5c;
  ulong local_58;
  stbtt_fontinfo *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar26;
  
  puVar4 = info->data;
  local_50 = info;
  uVar7 = stbtt__GetGlyfOffset(info,glyph_index);
  *pvertices = (stbtt_vertex *)0x0;
  if ((int)uVar7 < 0) {
LAB_001081e6:
    iVar15 = 0;
  }
  else {
    uVar10 = (ulong)uVar7;
    uVar6 = CONCAT11(puVar4[uVar10],puVar4[uVar10 + 1]);
    if ((short)uVar6 < 1) {
      if (uVar6 == 0xffff) {
        uVar14 = 0;
        uVar7 = 1;
        psVar22 = (stbtt_vertex *)0x0;
        puVar11 = (ushort *)(puVar4 + uVar10 + 10);
        do {
          iVar15 = (int)uVar14;
          local_5c = uVar7;
          if (uVar7 == 0) break;
          local_78 = (stbtt_vertex *)0x0;
          bVar18 = *(byte *)((long)puVar11 + 1);
          if ((bVar18 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                          ,0x58d,
                          "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
          }
          if ((bVar18 & 1) == 0) {
            iVar12 = (int)(char)puVar11[2];
            iVar8 = (int)*(char *)((long)puVar11 + 5);
            lVar17 = 6;
          }
          else {
            iVar12 = (int)CONCAT11((char)puVar11[2],*(undefined1 *)((long)puVar11 + 5));
            iVar8 = (int)(short)(puVar11[3] << 8 | puVar11[3] >> 8);
            lVar17 = 8;
          }
          puVar24 = (ushort *)(lVar17 + (long)puVar11);
          if ((bVar18 & 8) == 0) {
            if ((bVar18 & 0x40) == 0) {
              fVar30 = 0.0;
              if ((char)bVar18 < '\0') {
                fVar29 = (float)(int)(short)(*puVar24 << 8 | *puVar24 >> 8) * 6.1035156e-05;
                puVar1 = puVar24 + 3;
                fVar31 = (float)(int)(short)(puVar24[1] << 8 | puVar24[1] >> 8) * 6.1035156e-05;
                fVar30 = (float)(int)(short)(puVar24[2] << 8 | puVar24[2] >> 8) * 6.1035156e-05;
                puVar24 = puVar24 + 4;
                fVar28 = (float)(int)(short)(*puVar1 << 8 | *puVar1 >> 8) * 6.1035156e-05;
              }
              else {
                fVar31 = 0.0;
                fVar29 = 1.0;
                fVar28 = 1.0;
              }
            }
            else {
              puVar1 = puVar24 + 1;
              fVar29 = (float)(int)(short)(*puVar24 << 8 | *puVar24 >> 8) * 6.1035156e-05;
              puVar24 = puVar24 + 2;
              fVar30 = 0.0;
              fVar31 = 0.0;
              fVar28 = (float)(int)(short)(*puVar1 << 8 | *puVar1 >> 8) * 6.1035156e-05;
            }
          }
          else {
            fVar29 = (float)(int)(short)(*puVar24 << 8 | *puVar24 >> 8) * 6.1035156e-05;
            puVar24 = puVar24 + 1;
            fVar30 = 0.0;
            fVar31 = 0.0;
            fVar28 = fVar29;
          }
          uVar6 = puVar11[1];
          fVar27 = fVar29 * fVar29 + fVar31 * fVar31;
          comp_verts = (stbtt_vertex *)CONCAT44(comp_verts._4_4_,(float)iVar12);
          local_48 = CONCAT44(local_48._4_4_,(float)iVar8);
          local_40 = CONCAT44(local_40._4_4_,fVar29);
          local_38 = CONCAT44(local_38._4_4_,fVar30);
          local_58 = CONCAT44(local_58._4_4_,fVar28);
          local_68 = (stbtt_vertex *)CONCAT44(local_68._4_4_,fVar31);
          if (fVar27 < 0.0) {
            fVar27 = sqrtf(fVar27);
            fVar30 = (float)local_38;
            fVar28 = (float)local_58;
          }
          else {
            fVar27 = SQRT(fVar27);
          }
          fVar30 = fVar30 * fVar30 + fVar28 * fVar28;
          if (fVar30 < 0.0) {
            fVar30 = sqrtf(fVar30);
          }
          else {
            fVar30 = SQRT(fVar30);
          }
          uVar7 = stbtt_GetGlyphShape(local_50,(uint)(ushort)(uVar6 << 8 | uVar6 >> 8),&local_78);
          if ((int)uVar7 < 1) {
LAB_0010818d:
            bVar5 = true;
            uVar7 = bVar18 & 0x20;
          }
          else {
            uVar10 = (ulong)uVar7;
            lVar17 = 0;
            do {
              fVar28 = (float)(int)*(short *)((long)&local_78->x + lVar17);
              fVar29 = (float)(int)*(short *)((long)&local_78->y + lVar17);
              *(short *)((long)&local_78->x + lVar17) =
                   (short)(int)(((float)local_40 * fVar28 + (float)local_38 * fVar29 +
                                comp_verts._0_4_) * fVar27);
              *(short *)((long)&local_78->y + lVar17) =
                   (short)(int)((fVar28 * local_68._0_4_ + fVar29 * (float)local_58 +
                                (float)local_48) * fVar30);
              fVar28 = (float)(int)*(short *)((long)&local_78->cx + lVar17);
              fVar29 = (float)(int)*(short *)((long)&local_78->cy + lVar17);
              *(short *)((long)&local_78->cx + lVar17) =
                   (short)(int)(((float)local_40 * fVar28 + (float)local_38 * fVar29 +
                                comp_verts._0_4_) * fVar27);
              *(short *)((long)&local_78->cy + lVar17) =
                   (short)(int)((fVar28 * local_68._0_4_ + fVar29 * (float)local_58 +
                                (float)local_48) * fVar30);
              lVar17 = lVar17 + 10;
            } while (uVar10 * 10 != lVar17);
            __dest = (stbtt_vertex *)malloc((ulong)(uVar7 + iVar15) * 10);
            if (__dest != (stbtt_vertex *)0x0) {
              local_38 = uVar10;
              if (0 < iVar15) {
                memcpy(__dest,psVar22,uVar14 * 10);
              }
              memcpy(__dest + uVar14,local_78,local_38 * 10);
              if (psVar22 != (stbtt_vertex *)0x0) {
                free(psVar22);
              }
              free(local_78);
              psVar22 = __dest;
              uVar14 = (ulong)(uVar7 + iVar15);
              goto LAB_0010818d;
            }
            if (psVar22 != (stbtt_vertex *)0x0) {
              free(psVar22);
            }
            if (local_78 != (stbtt_vertex *)0x0) {
              free(local_78);
            }
            bVar5 = false;
            uVar7 = local_5c;
          }
          iVar15 = (int)uVar14;
          puVar11 = puVar24;
        } while (bVar5);
        if (local_5c != 0) goto LAB_001081e6;
      }
      else {
        if ((short)((ushort)puVar4[uVar10] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                        ,0x5c2,
                        "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
        }
        iVar15 = 0;
        psVar22 = (stbtt_vertex *)0x0;
      }
    }
    else {
      uVar14 = (ulong)((uint)uVar6 * 2);
      bVar18 = puVar4[uVar14 + uVar10 + 10];
      local_38 = (ulong)puVar4[uVar14 + uVar10 + 0xb];
      bVar20 = puVar4[uVar14 + uVar10 + 8];
      bVar2 = puVar4[uVar14 + uVar10 + 9];
      iVar12 = (uint)bVar20 * 0x100 + (uint)bVar2;
      local_68 = (stbtt_vertex *)malloc((ulong)((iVar12 + (uint)uVar6 * 2) * 10 + 10));
      iVar15 = 0;
      if (local_68 != (stbtt_vertex *)0x0) {
        puVar11 = (ushort *)(puVar4 + (ulong)bVar18 * 0x100 + local_38 + uVar14 + uVar10 + 0xc);
        uVar7 = (uint)CONCAT11(bVar20,bVar2);
        lVar17 = 0;
        bVar18 = 0;
        bVar20 = 0;
        do {
          if (bVar20 == 0) {
            bVar18 = (byte)*puVar11;
            if ((bVar18 & 8) == 0) {
              puVar11 = (ushort *)((long)puVar11 + 1);
            }
            else {
              bVar20 = *(byte *)((long)puVar11 + 1);
              puVar11 = puVar11 + 1;
            }
          }
          else {
            bVar20 = bVar20 - 1;
          }
          (&local_68[uVar14].type)[lVar17] = bVar18;
          lVar17 = lVar17 + 10;
        } while ((ulong)(uVar7 * 2 + 2) * 5 != lVar17);
        lVar17 = 0;
        sVar19 = 0;
        do {
          bVar18 = (&local_68[uVar14].type)[lVar17];
          if ((bVar18 & 2) == 0) {
            if ((bVar18 & 0x10) == 0) {
              sVar19 = sVar19 + (*puVar11 << 8 | *puVar11 >> 8);
              puVar11 = puVar11 + 1;
            }
          }
          else {
            uVar6 = *puVar11;
            puVar11 = (ushort *)((long)puVar11 + 1);
            uVar21 = -(ushort)(byte)uVar6;
            if ((bVar18 & 0x10) != 0) {
              uVar21 = (ushort)(byte)uVar6;
            }
            sVar19 = sVar19 + uVar21;
          }
          *(short *)((long)&local_68[uVar14].x + lVar17) = sVar19;
          lVar17 = lVar17 + 10;
        } while ((ulong)(uVar7 * 2 + 2) * 5 != lVar17);
        lVar17 = 0;
        sVar19 = 0;
        do {
          bVar18 = (&local_68[uVar14 & 0xffff].type)[lVar17];
          if ((bVar18 & 4) == 0) {
            if ((bVar18 & 0x20) == 0) {
              sVar19 = sVar19 + (*puVar11 << 8 | *puVar11 >> 8);
              puVar11 = puVar11 + 1;
            }
          }
          else {
            uVar6 = *puVar11;
            puVar11 = (ushort *)((long)puVar11 + 1);
            uVar21 = -(ushort)(byte)uVar6;
            if ((bVar18 & 0x20) != 0) {
              uVar21 = (ushort)(byte)uVar6;
            }
            sVar19 = sVar19 + uVar21;
          }
          *(short *)((long)&local_68[uVar14 & 0xffff].y + lVar17) = sVar19;
          lVar17 = lVar17 + 10;
        } while ((ulong)(uVar7 * 2 + 2) * 5 != lVar17);
        iVar8 = 0;
        iVar15 = 0;
        comp_verts = (stbtt_vertex *)0x0;
        iVar9 = 0;
        local_58 = 0;
        local_38 = 0;
        sy = 0;
        uVar7 = 0;
        local_40 = 0;
        local_48 = 0;
        start_off = 0;
        was_off = 0;
        psVar22 = local_68;
        local_50 = (stbtt_fontinfo *)uVar14;
        do {
          lVar17 = (long)(iVar15 + (int)local_50);
          bVar18 = psVar22[lVar17].type;
          sVar19 = psVar22[lVar17].x;
          sVar3 = psVar22[lVar17].y;
          uVar25 = (uint)sVar19;
          uVar26 = (ulong)uVar25;
          uVar23 = (uint)sVar3;
          uVar14 = (ulong)uVar23;
          if (iVar9 == iVar15) {
            if (iVar15 != 0) {
              iVar8 = stbtt__close_shape(psVar22,iVar8,was_off,start_off,uVar7,sy,
                                         (stbtt_int32)local_38,(stbtt_int32)local_58,(int)local_48,
                                         (int)local_40);
            }
            if ((bVar18 & 1) == 0) {
              local_58 = uVar14;
              local_38 = uVar26;
              if ((local_68[lVar17 + 1].type & 1) == 0) {
                uVar23 = (int)((int)local_68[lVar17 + 1].y + uVar23) >> 1;
                uVar25 = (int)((int)local_68[lVar17 + 1].x + uVar25) >> 1;
              }
              else {
                uVar23 = (uint)local_68[lVar17 + 1].y;
                iVar15 = iVar15 + 1;
                uVar25 = (int)local_68[lVar17 + 1].x;
              }
            }
            start_off = bVar18 & 1 ^ 1;
            local_68[iVar8].type = '\x01';
            local_68[iVar8].x = (short)uVar25;
            local_68[iVar8].y = (short)uVar23;
            local_68[iVar8].cx = 0;
            local_68[iVar8].cy = 0;
            iVar9 = (ushort)(*(ushort *)(puVar4 + (long)(int)comp_verts * 2 + uVar10 + 10) << 8 |
                            *(ushort *)(puVar4 + (long)(int)comp_verts * 2 + uVar10 + 10) >> 8) + 1;
            comp_verts = (stbtt_vertex *)(ulong)((int)comp_verts + 1);
            was_off = 0;
            psVar22 = local_68;
            iVar16 = iVar15;
            iVar8 = iVar8 + 1;
            uVar7 = uVar25;
            sy = uVar23;
          }
          else {
            sVar13 = (short)local_40;
            iVar16 = iVar15;
            if ((bVar18 & 1) == 0) {
              iVar15 = iVar8;
              if (was_off != 0) {
                iVar15 = iVar8 + 1;
                psVar22[iVar8].type = '\x03';
                psVar22[iVar8].x = (short)((int)local_48 + uVar25 >> 1);
                psVar22[iVar8].y = (short)((int)local_40 + uVar23 >> 1);
                psVar22[iVar8].cx = (short)local_48;
                psVar22[iVar8].cy = sVar13;
              }
              was_off = 1;
              iVar8 = iVar15;
              local_48 = uVar26;
              local_40 = uVar14;
            }
            else {
              psVar22 = psVar22 + iVar8;
              if (was_off == 0) {
                psVar22->type = '\x02';
                psVar22->x = sVar19;
                psVar22->y = sVar3;
                psVar22->cx = 0;
                sVar13 = 0;
              }
              else {
                psVar22->type = '\x03';
                psVar22->x = sVar19;
                psVar22->y = sVar3;
                psVar22->cx = (short)local_48;
              }
              psVar22->cy = sVar13;
              was_off = 0;
              psVar22 = local_68;
              iVar8 = iVar8 + 1;
            }
          }
          iVar15 = iVar16 + 1;
        } while (iVar16 < iVar12);
        iVar15 = stbtt__close_shape(psVar22,iVar8,was_off,start_off,uVar7,sy,(stbtt_int32)local_38,
                                    (stbtt_int32)local_58,(stbtt_int32)local_48,
                                    (stbtt_int32)local_40);
      }
      psVar22 = local_68;
      if (local_68 == (stbtt_vertex *)0x0) {
        return 0;
      }
    }
    *pvertices = psVar22;
  }
  return iVar15;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   stbtt_int16 numberOfContours;
   stbtt_uint8 *endPtsOfContours;
   stbtt_uint8 *data = info->data;
   stbtt_vertex *vertices=0;
   int num_vertices=0;
   int g = stbtt__GetGlyfOffset(info, glyph_index);

   *pvertices = NULL;

   if (g < 0) return 0;

   numberOfContours = ttSHORT(data + g);

   if (numberOfContours > 0) {
      stbtt_uint8 flags=0,flagcount;
      stbtt_int32 ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
      stbtt_int32 x,y,cx,cy,sx,sy, scx,scy;
      stbtt_uint8 *points;
      endPtsOfContours = (data + g + 10);
      ins = ttUSHORT(data + g + 10 + numberOfContours * 2);
      points = data + g + 10 + numberOfContours * 2 + 2 + ins;

      n = 1+ttUSHORT(endPtsOfContours + numberOfContours*2-2);

      m = n + 2*numberOfContours;  // a loose bound on how many vertices we might need
      vertices = (stbtt_vertex *) STBTT_malloc(m * sizeof(vertices[0]), info->userdata);
      if (vertices == 0)
         return 0;

      next_move = 0;
      flagcount=0;

      // in first pass, we load uninterpreted data into the allocated array
      // above, shifted to the end of the array so we won't overwrite it when
      // we create our final data starting from the front

      off = m - n; // starting offset for uninterpreted data, regardless of how m ends up being calculated

      // first load flags

      for (i=0; i < n; ++i) {
         if (flagcount == 0) {
            flags = *points++;
            if (flags & 8)
               flagcount = *points++;
         } else
            --flagcount;
         vertices[off+i].type = flags;
      }

      // now load x coordinates
      x=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 2) {
            stbtt_int16 dx = *points++;
            x += (flags & 16) ? dx : -dx; // ???
         } else {
            if (!(flags & 16)) {
               x = x + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].x = (stbtt_int16) x;
      }

      // now load y coordinates
      y=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 4) {
            stbtt_int16 dy = *points++;
            y += (flags & 32) ? dy : -dy; // ???
         } else {
            if (!(flags & 32)) {
               y = y + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].y = (stbtt_int16) y;
      }

      // now convert them to our format
      num_vertices=0;
      sx = sy = cx = cy = scx = scy = 0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         x     = (stbtt_int16) vertices[off+i].x;
         y     = (stbtt_int16) vertices[off+i].y;

         if (next_move == i) {
            if (i != 0)
               num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

            // now start the new one               
            start_off = !(flags & 1);
            if (start_off) {
               // if we start off with an off-curve point, then when we need to find a point on the curve
               // where we can start, and we need to save some state for when we wraparound.
               scx = x;
               scy = y;
               if (!(vertices[off+i+1].type & 1)) {
                  // next point is also a curve point, so interpolate an on-point curve
                  sx = (x + (stbtt_int32) vertices[off+i+1].x) >> 1;
                  sy = (y + (stbtt_int32) vertices[off+i+1].y) >> 1;
               } else {
                  // otherwise just use the next point as our start point
                  sx = (stbtt_int32) vertices[off+i+1].x;
                  sy = (stbtt_int32) vertices[off+i+1].y;
                  ++i; // we're using point i+1 as the starting point, so skip it
               }
            } else {
               sx = x;
               sy = y;
            }
            stbtt_setvertex(&vertices[num_vertices++], STBTT_vmove,sx,sy,0,0);
            was_off = 0;
            next_move = 1 + ttUSHORT(endPtsOfContours+j*2);
            ++j;
         } else {
            if (!(flags & 1)) { // if it's a curve
               if (was_off) // two off-curve control points in a row means interpolate an on-curve midpoint
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
               cx = x;
               cy = y;
               was_off = 1;
            } else {
               if (was_off)
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, x,y, cx, cy);
               else
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vline, x,y,0,0);
               was_off = 0;
            }
         }
      }
      num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
   } else if (numberOfContours == -1) {
      // Compound shapes.
      int more = 1;
      stbtt_uint8 *comp = data + g + 10;
      num_vertices = 0;
      vertices = 0;
      while (more) {
         stbtt_uint16 flags, gidx;
         int comp_num_verts = 0, i;
         stbtt_vertex *comp_verts = 0, *tmp = 0;
         float mtx[6] = {1,0,0,1,0,0}, m, n;
         
         flags = ttSHORT(comp); comp+=2;
         gidx = ttSHORT(comp); comp+=2;

         if (flags & 2) { // XY values
            if (flags & 1) { // shorts
               mtx[4] = ttSHORT(comp); comp+=2;
               mtx[5] = ttSHORT(comp); comp+=2;
            } else {
               mtx[4] = ttCHAR(comp); comp+=1;
               mtx[5] = ttCHAR(comp); comp+=1;
            }
         }
         else {
            // @TODO handle matching point
            STBTT_assert(0);
         }
         if (flags & (1<<3)) { // WE_HAVE_A_SCALE
            mtx[0] = mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
         } else if (flags & (1<<6)) { // WE_HAVE_AN_X_AND_YSCALE
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         } else if (flags & (1<<7)) { // WE_HAVE_A_TWO_BY_TWO
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[2] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         }
         
         // Find transformation scales.
         m = (float) STBTT_sqrt(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
         n = (float) STBTT_sqrt(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

         // Get indexed glyph.
         comp_num_verts = stbtt_GetGlyphShape(info, gidx, &comp_verts);
         if (comp_num_verts > 0) {
            // Transform vertices.
            for (i = 0; i < comp_num_verts; ++i) {
               stbtt_vertex* v = &comp_verts[i];
               stbtt_vertex_type x,y;
               x=v->x; y=v->y;
               v->x = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->y = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
               x=v->cx; y=v->cy;
               v->cx = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->cy = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
            }
            // Append vertices.
            tmp = (stbtt_vertex*)STBTT_malloc((num_vertices+comp_num_verts)*sizeof(stbtt_vertex), info->userdata);
            if (!tmp) {
               if (vertices) STBTT_free(vertices, info->userdata);
               if (comp_verts) STBTT_free(comp_verts, info->userdata);
               return 0;
            }
            if (num_vertices > 0) STBTT_memcpy(tmp, vertices, num_vertices*sizeof(stbtt_vertex));
            STBTT_memcpy(tmp+num_vertices, comp_verts, comp_num_verts*sizeof(stbtt_vertex));
            if (vertices) STBTT_free(vertices, info->userdata);
            vertices = tmp;
            STBTT_free(comp_verts, info->userdata);
            num_vertices += comp_num_verts;
         }
         // More components ?
         more = flags & (1<<5);
      }
   } else if (numberOfContours < 0) {
      // @TODO other compound variations?
      STBTT_assert(0);
   } else {
      // numberOfCounters == 0, do nothing
   }

   *pvertices = vertices;
   return num_vertices;
}